

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O3

void __thiscall Jinx::Impl::Parser::ErrorWriteDetails(Parser *this)

{
  pointer pSVar1;
  pointer pSVar2;
  Symbol *pSVar3;
  byte bVar4;
  size_type sVar5;
  ulong uVar6;
  pointer pSVar8;
  pointer pSVar9;
  ulong uVar10;
  char *__s;
  ulong uVar11;
  SymbolListCItr curr;
  SymbolListCItr symbol;
  ulong uVar12;
  bool bVar13;
  String markerText;
  String symbolText;
  pointer local_88;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> local_80;
  String local_60;
  Parser *local_40;
  ulong local_38;
  size_type sVar7;
  
  pSVar8 = (this->m_currentSymbol)._M_current;
  pSVar2 = (this->m_symbolList->
           super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pSVar9 = pSVar8 + -1;
  if (pSVar2 != pSVar8) {
    pSVar9 = pSVar8;
  }
  pSVar8 = pSVar9 + -1;
  if (pSVar9->type != NewLine) {
    pSVar8 = pSVar9;
  }
  if (pSVar8->type != NewLine) {
    pSVar9 = pSVar8;
    do {
      symbol._M_current = pSVar9;
      if (pSVar9 == (this->m_symbolList->
                    super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                    _M_impl.super__Vector_impl_data._M_start) goto joined_r0x0011eb77;
      pSVar8 = pSVar9 + -1;
      pSVar1 = pSVar9 + -1;
      pSVar9 = pSVar8;
    } while (pSVar1->type != NewLine);
  }
  pSVar9 = pSVar8 + 1;
  symbol._M_current = pSVar9;
joined_r0x0011eb77:
  for (; (local_88 = pSVar2, pSVar9 != pSVar2 && (local_88 = pSVar9, pSVar9->type != NewLine));
      pSVar9 = pSVar9 + 1) {
  }
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_40 = this;
  if (symbol._M_current == local_88) {
    uVar6 = 0;
    uVar10 = 0;
    uVar11 = 0;
  }
  else {
    uVar11 = 0;
    uVar10 = 0;
    uVar6 = 0;
    bVar4 = 0;
    do {
      local_38 = uVar11;
      WriteSymbol(symbol,&local_60);
      sVar5 = local_60._M_string_length;
      pSVar3 = (local_40->m_currentSymbol)._M_current;
      LogWrite(Error,local_60._M_dataplus._M_p);
      bVar13 = symbol._M_current == pSVar3;
      sVar7 = sVar5;
      uVar11 = uVar6;
      if ((bool)(bVar4 | bVar13)) {
        sVar7 = 0;
        uVar11 = uVar10;
      }
      uVar10 = uVar11;
      uVar6 = sVar7 + uVar6;
      uVar11 = local_38 + sVar5;
      symbol._M_current = symbol._M_current + 1;
      bVar4 = bVar4 | bVar13;
    } while (symbol._M_current != local_88);
  }
  uVar12 = 0;
  if (uVar11 != 0) {
    uVar12 = uVar11 - 1;
  }
  if (uVar6 < uVar12) {
    uVar10 = uVar6;
  }
  LogWrite(Error,"\n");
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::reserve
            (&local_80,0x20);
  if (1 < uVar11) {
    uVar6 = 0;
    do {
      __s = "^";
      if (uVar6 < uVar10) {
        __s = " ";
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::append
                (&local_80,__s);
      uVar6 = uVar6 + 1;
    } while (uVar6 < uVar12);
  }
  LogWriteLine(Error,local_80._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    MemFree(local_80._M_dataplus._M_p,
            CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,local_80.field_2._M_local_buf[0])
            + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    MemFree(local_60._M_dataplus._M_p,
            CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,local_60.field_2._M_local_buf[0])
            + 1);
  }
  return;
}

Assistant:

inline_t void Parser::ErrorWriteDetails() const
	{
		// Write line of code containing error

		// Find starting symbol of error line.  Harder than you might think
		auto start = m_currentSymbol;
		if (start == m_symbolList.end())
			--start;
		if (start->type == SymbolType::NewLine)
			--start;
		while (start->type != SymbolType::NewLine && start != m_symbolList.begin())
			--start;
		if (start->type == SymbolType::NewLine)
			++start;

		// Once we find the supposed start, find the end from that location
		auto end = start;
		while (end != m_symbolList.end() && end->type != SymbolType::NewLine)
			++end;

		// Print out the symbols and find error start index
		bool foundError = false;
		size_t errorIndex = 0;
		size_t lastErrorIndex = 0;
		size_t endIndex = 0;
		String symbolText;
		for (auto curr = start; curr != end; ++curr)
		{
			WriteSymbol(curr, symbolText);
			if (curr == m_currentSymbol)
				foundError = true;
			if (!foundError)
			{
				lastErrorIndex = errorIndex;
				errorIndex += symbolText.size();
			}
			endIndex += symbolText.size();
			LogWrite(LogLevel::Error, symbolText.c_str());
		}
		if (endIndex)
			--endIndex;
		if (errorIndex >= endIndex)
			errorIndex = lastErrorIndex;
		LogWrite(LogLevel::Error, "\n");

		// Write marker showing location of error
		String markerText;
		markerText.reserve(32);
		for (size_t i = 0; i < endIndex; ++i)
			markerText += (i < errorIndex) ? " " : "^";
		LogWriteLine(LogLevel::Error, markerText.c_str());
	}